

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiWindow::ImGuiWindow(ImGuiWindow *this,ImGuiContext *context,char *name)

{
  ImU32 IVar1;
  ImGuiID IVar2;
  ImVector<unsigned_int> *this_00;
  size_t sVar3;
  char *in_RDX;
  undefined8 *in_RDI;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  ImRect *in_stack_ffffffffffffff20;
  ImRect *pIVar4;
  ImRect *this_01;
  ImRect *str;
  ImGuiWindow *this_02;
  ImDrawListSharedData *shared_data;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 uStack_88;
  undefined4 local_84;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uStack_78;
  undefined8 uStack_74;
  ImVec2 local_6c;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 local_3c;
  ImVec2 local_34;
  ImVec2 local_2c [2];
  char *local_18;
  
  local_18 = in_RDX;
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 2));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 3));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 4));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 5));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 6));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 7));
  ImVec2::ImVec2((ImVec2 *)((long)in_RDI + 0x54));
  ImVec2::ImVec2((ImVec2 *)((long)in_RDI + 0x5c));
  ImVec2::ImVec2((ImVec2 *)((long)in_RDI + 100));
  ImVec2::ImVec2((ImVec2 *)((long)in_RDI + 0x6c));
  ImVec2::ImVec2((ImVec2 *)((long)in_RDI + 0x74));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x16));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x17));
  ImVector<unsigned_int>::ImVector((ImVector<unsigned_int> *)(in_RDI + 0x18));
  shared_data = (ImDrawListSharedData *)(in_RDI + 0x1a);
  ImGuiWindowTempData::ImGuiWindowTempData
            ((ImGuiWindowTempData *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  ImRect::ImRect(in_stack_ffffffffffffff20);
  ImRect::ImRect(in_stack_ffffffffffffff20);
  ImRect::ImRect(in_stack_ffffffffffffff20);
  ImRect::ImRect(in_stack_ffffffffffffff20);
  ImRect::ImRect(in_stack_ffffffffffffff20);
  ImRect::ImRect(in_stack_ffffffffffffff20);
  ImGuiStorage::ImGuiStorage((ImGuiStorage *)0x1b5fc9);
  ImVector<ImGuiColumns>::ImVector((ImVector<ImGuiColumns> *)(in_RDI + 0x53));
  this_02 = (ImGuiWindow *)(in_RDI + 0x57);
  ImDrawList::ImDrawList
            ((ImDrawList *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),shared_data
            );
  this_01 = (ImRect *)(in_RDI + 0x76);
  str = (ImRect *)(in_RDI + 0x72);
  do {
    pIVar4 = str;
    ImRect::ImRect(in_stack_ffffffffffffff20);
    str = pIVar4 + 1;
  } while (str != this_01);
  this_00 = (ImVector<unsigned_int> *)ImStrdup((char *)this_01);
  *in_RDI = this_00;
  IVar1 = ImHashStr(local_18,0,0);
  *(ImU32 *)(in_RDI + 1) = IVar1;
  ImVector<unsigned_int>::push_back
            (this_00,(uint *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  ImVec2::ImVec2(local_2c,0.0,0.0);
  *(ImVec2 *)(in_RDI + 2) = local_2c[0];
  ImVec2::ImVec2(&local_34,0.0,0.0);
  *(ImVec2 *)(in_RDI + 4) = local_34;
  in_RDI[3] = in_RDI[4];
  ImVec2::ImVec2(&local_3c,0.0,0.0);
  *(ImVec2 *)(in_RDI + 6) = local_3c;
  in_RDI[5] = in_RDI[6];
  ImVec2::ImVec2(&local_44,0.0,0.0);
  *(ImVec2 *)(in_RDI + 7) = local_44;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)((long)in_RDI + 0x44) = 0;
  sVar3 = strlen(local_18);
  *(int *)(in_RDI + 9) = (int)sVar3 + 1;
  IVar2 = GetID(this_02,(char *)str,(char *)this_01);
  *(ImGuiID *)((long)in_RDI + 0x4c) = IVar2;
  *(undefined4 *)(in_RDI + 10) = 0;
  ImVec2::ImVec2(&local_4c,0.0,0.0);
  *(ImVec2 *)((long)in_RDI + 0x54) = local_4c;
  ImVec2::ImVec2(&local_54,3.4028235e+38,3.4028235e+38);
  *(ImVec2 *)((long)in_RDI + 100) = local_54;
  ImVec2::ImVec2(&local_5c,0.5,0.5);
  *(ImVec2 *)((long)in_RDI + 0x6c) = local_5c;
  ImVec2::ImVec2(&local_64,0.0,0.0);
  *(ImVec2 *)((long)in_RDI + 0x74) = local_64;
  *(undefined1 *)((long)in_RDI + 0x7d) = 0;
  *(undefined1 *)((long)in_RDI + 0x7c) = 0;
  *(undefined1 *)((long)in_RDI + 0x7f) = 0;
  *(undefined1 *)((long)in_RDI + 0x7e) = 0;
  *(undefined1 *)(in_RDI + 0x10) = 0;
  *(undefined1 *)((long)in_RDI + 0x81) = 0;
  *(undefined1 *)((long)in_RDI + 0x82) = 0;
  *(undefined1 *)((long)in_RDI + 0x83) = 0;
  *(undefined1 *)((long)in_RDI + 0x84) = 0;
  *(undefined1 *)((long)in_RDI + 0x85) = 0;
  *(undefined1 *)((long)in_RDI + 0x86) = 0;
  *(undefined1 *)((long)in_RDI + 0x87) = 0;
  *(undefined1 *)(in_RDI + 0x11) = 0xff;
  *(undefined2 *)((long)in_RDI + 0x8a) = 0;
  *(undefined2 *)((long)in_RDI + 0x8c) = 0xffff;
  *(undefined2 *)((long)in_RDI + 0x8e) = 0xffff;
  *(undefined4 *)(in_RDI + 0x12) = 0;
  *(undefined1 *)((long)in_RDI + 0x95) = 0xff;
  *(undefined1 *)((long)in_RDI + 0x94) = 0xff;
  *(undefined1 *)((long)in_RDI + 0x96) = 0;
  *(undefined1 *)((long)in_RDI + 0x97) = 0;
  *(undefined4 *)(in_RDI + 0x13) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x14) = 0;
  *(undefined4 *)((long)in_RDI + 0x9c) = 0;
  *(undefined4 *)((long)in_RDI + 0xac) = 0xf;
  *(undefined4 *)(in_RDI + 0x15) = 0xf;
  *(undefined4 *)((long)in_RDI + 0xa4) = 0xf;
  ImVec2::ImVec2(&local_6c,3.4028235e+38,3.4028235e+38);
  *(ImVec2 *)(in_RDI + 0x17) = local_6c;
  in_RDI[0x16] = in_RDI[0x17];
  ImRect::ImRect(this_01,(float)((ulong)pIVar4 >> 0x20),SUB84(pIVar4,0),
                 (float)((ulong)this_00 >> 0x20),SUB84(this_00,0));
  in_RDI[0x45] = CONCAT44(uStack_78,in_stack_ffffffffffffff84);
  in_RDI[0x46] = uStack_74;
  *(undefined4 *)(in_RDI + 0x4f) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x27c) = 0xbf800000;
  *(undefined4 *)(in_RDI + 0x50) = 0;
  *(undefined4 *)(in_RDI + 0x55) = 0x3f800000;
  *(undefined4 *)((long)in_RDI + 0x2ac) = 0xffffffff;
  in_RDI[0x56] = in_RDI + 0x57;
  *(undefined8 *)(in_RDI[0x56] + 0x40) = *in_RDI;
  in_RDI[0x6c] = 0;
  in_RDI[0x6d] = 0;
  in_RDI[0x6e] = 0;
  in_RDI[0x6f] = 0;
  *(undefined4 *)((long)in_RDI + 0x38c) = 0;
  *(undefined4 *)(in_RDI + 0x71) = 0;
  ImRect::ImRect((ImRect *)this_00);
  in_RDI[0x74] = CONCAT44(uStack_88,in_stack_ffffffffffffff74);
  in_RDI[0x75] = CONCAT44(in_stack_ffffffffffffff80,local_84);
  in_RDI[0x72] = in_RDI[0x74];
  in_RDI[0x73] = in_RDI[0x75];
  in_RDI[0x70] = 0;
  *(undefined1 *)(in_RDI + 0x76) = 0;
  *(undefined4 *)(in_RDI + 0x77) = 0;
  *(undefined4 *)((long)in_RDI + 0x3b4) = 0;
  return;
}

Assistant:

ImGuiWindow::ImGuiWindow(ImGuiContext* context, const char* name)
    : DrawListInst(&context->DrawListSharedData)
{
    Name = ImStrdup(name);
    ID = ImHashStr(name);
    IDStack.push_back(ID);
    Flags = ImGuiWindowFlags_None;
    Pos = ImVec2(0.0f, 0.0f);
    Size = SizeFull = ImVec2(0.0f, 0.0f);
    ContentSize = ContentSizeExplicit = ImVec2(0.0f, 0.0f);
    WindowPadding = ImVec2(0.0f, 0.0f);
    WindowRounding = 0.0f;
    WindowBorderSize = 0.0f;
    NameBufLen = (int)strlen(name) + 1;
    MoveId = GetID("#MOVE");
    ChildId = 0;
    Scroll = ImVec2(0.0f, 0.0f);
    ScrollTarget = ImVec2(FLT_MAX, FLT_MAX);
    ScrollTargetCenterRatio = ImVec2(0.5f, 0.5f);
    ScrollbarSizes = ImVec2(0.0f, 0.0f);
    ScrollbarX = ScrollbarY = false;
    Active = WasActive = false;
    WriteAccessed = false;
    Collapsed = false;
    WantCollapseToggle = false;
    SkipItems = false;
    Appearing = false;
    Hidden = false;
    IsFallbackWindow = false;
    HasCloseButton = false;
    ResizeBorderHeld = -1;
    BeginCount = 0;
    BeginOrderWithinParent = -1;
    BeginOrderWithinContext = -1;
    PopupId = 0;
    AutoFitFramesX = AutoFitFramesY = -1;
    AutoFitChildAxises = 0x00;
    AutoFitOnlyGrows = false;
    AutoPosLastDirection = ImGuiDir_None;
    HiddenFramesCanSkipItems = HiddenFramesCannotSkipItems = 0;
    SetWindowPosAllowFlags = SetWindowSizeAllowFlags = SetWindowCollapsedAllowFlags = ImGuiCond_Always | ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing;
    SetWindowPosVal = SetWindowPosPivot = ImVec2(FLT_MAX, FLT_MAX);

    InnerRect = ImRect(0.0f, 0.0f, 0.0f, 0.0f); // Clear so the InnerRect.GetSize() code in Begin() doesn't lead to overflow even if the result isn't used.

    LastFrameActive = -1;
    LastTimeActive = -1.0f;
    ItemWidthDefault = 0.0f;
    FontWindowScale = 1.0f;
    SettingsOffset = -1;

    DrawList = &DrawListInst;
    DrawList->_OwnerName = Name;
    ParentWindow = NULL;
    RootWindow = NULL;
    RootWindowForTitleBarHighlight = NULL;
    RootWindowForNav = NULL;

    NavLastIds[0] = NavLastIds[1] = 0;
    NavRectRel[0] = NavRectRel[1] = ImRect();
    NavLastChildNavWindow = NULL;

    MemoryCompacted = false;
    MemoryDrawListIdxCapacity = MemoryDrawListVtxCapacity = 0;
}